

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

Test * ParserTestReservedWords::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestReservedWords((ParserTestReservedWords *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, ReservedWords) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule build\n"
"  command = rule run $out\n"
"build subninja: build include default foo.cc\n"
"default subninja\n"));
}